

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateClipLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  float fVar3;
  pointer pcVar4;
  bool bVar5;
  undefined1 *puVar6;
  long *plVar7;
  size_type *psVar8;
  Result *_result;
  string err;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (bVar5) {
    pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar5) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar5 = Result::good(__return_storage_ptr__);
      if (bVar5) {
        pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar5) {
          if (layer->_oneof_case_[0] == 0x294) {
            puVar6 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar6 = Specification::_ClipLayerParams_default_instance_;
          }
          fVar3 = (float)(((ConvolutionLayerParams *)puVar6)->kernelsize_).current_size_;
          piVar2 = &(((ConvolutionLayerParams *)puVar6)->kernelsize_).total_size_;
          if (fVar3 < (float)*piVar2 || fVar3 == (float)*piVar2) {
            Result::Result(__return_storage_ptr__);
          }
          else {
            std::operator+(&local_40,"Value of minval should be smaller than maxval for \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
            psVar8 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_60.field_2._M_allocated_capacity = *psVar8;
              local_60.field_2._8_8_ = plVar7[3];
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar8;
              local_60._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_60._M_string_length = plVar7[1];
            *plVar7 = (long)psVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateClipLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.clip();
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}